

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opaque.c
# Opt level: O3

int exr_attr_opaquedata_init(exr_context_t ctxt,exr_attr_opaquedata_t *u,size_t b)

{
  int iVar1;
  void *pvVar2;
  
  if (ctxt == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    if (u == (exr_attr_opaquedata_t *)0x0) {
      iVar1 = (**(code **)(ctxt + 0x40))
                        (ctxt,3,"Invalid reference to opaque data object to initialize");
      return iVar1;
    }
    if (b >> 0x1f != 0) {
      iVar1 = (**(code **)(ctxt + 0x48))
                        (ctxt,3,"Invalid size for opaque data (%lu bytes, must be <= INT32_MAX)",b,
                         *(code **)(ctxt + 0x48));
      return iVar1;
    }
    u->unpack_func_ptr =
         (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr_ptr *)0x0;
    u->pack_func_ptr = (_func_exr_result_t_exr_context_t_void_ptr_int32_t_int32_t_ptr_void_ptr *)0x0
    ;
    u->packed_data = (void *)0x0;
    u->unpacked_data = (void *)0x0;
    u->size = 0;
    u->unpacked_size = 0;
    u->packed_alloc_size = 0;
    u->pad[0] = '\0';
    u->pad[1] = '\0';
    u->pad[2] = '\0';
    u->pad[3] = '\0';
    u->destroy_unpacked_func_ptr = (_func_void_exr_context_t_void_ptr_int32_t *)0x0;
    if (b != 0) {
      pvVar2 = (void *)(**(code **)(ctxt + 0x58))(b);
      u->packed_data = pvVar2;
      if (pvVar2 == (void *)0x0) {
        iVar1 = (**(code **)(ctxt + 0x38))(ctxt,1);
        return iVar1;
      }
    }
    u->size = (int32_t)b;
    u->packed_alloc_size = (int32_t)b;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

OPENEXR_CORE_INTERNAL_NAMESPACE_SOURCE_ENTER
/**************************************/

int
exr_attr_opaquedata_init (
    exr_context_t ctxt, exr_attr_opaquedata_t* u, size_t b)
{
    exr_attr_opaquedata_t nil = {0};

    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (!u)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to opaque data object to initialize");

    if (b > (size_t) INT32_MAX)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid size for opaque data (%" PRIu64
            " bytes, must be <= INT32_MAX)",
            (uint64_t) b);

    *u = nil;
    if (b > 0)
    {

        u->packed_data = pctxt->alloc_fn (b);
        if (!u->packed_data)
            return pctxt->standard_error (pctxt, EXR_ERR_OUT_OF_MEMORY);
    }
    u->size              = (int32_t) b;
    u->packed_alloc_size = (int32_t) b;
    return EXR_ERR_SUCCESS;
}